

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

int64_t google::protobuf::operator/(Duration *d1,Duration *d2)

{
  uint64_t uVar1;
  uint128 uVar2;
  bool negative2;
  bool negative1;
  uint128 value2;
  uint128 value1;
  bool local_4a;
  bool local_49;
  uint128 local_48;
  uint128 local_38;
  
  anon_unknown_9::ToUint128(d1,&local_38,&local_49);
  anon_unknown_9::ToUint128(d2,&local_48,&local_4a);
  uVar2 = absl::lts_20240722::operator/(local_38,local_48);
  uVar1 = uVar2.lo_;
  if (local_49 != local_4a) {
    uVar1 = -uVar2.lo_;
  }
  return uVar1;
}

Assistant:

int64_t operator/(const Duration& d1, const Duration& d2) {
  bool negative1, negative2;
  absl::uint128 value1, value2;
  ToUint128(d1, &value1, &negative1);
  ToUint128(d2, &value2, &negative2);
  int64_t result = absl::Uint128Low64(value1 / value2);
  if (negative1 != negative2) {
    result = -result;
  }
  return result;
}